

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O0

void __thiscall QPDFMatrix::concat(QPDFMatrix *this,QPDFMatrix *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double fp;
  double ep;
  double dp;
  double cp;
  double bp;
  double ap;
  QPDFMatrix *other_local;
  QPDFMatrix *this_local;
  
  dVar1 = other->a;
  dVar2 = other->b;
  dVar3 = this->a;
  dVar4 = other->c;
  dVar5 = other->d;
  dVar6 = this->b;
  dVar7 = other->c;
  dVar8 = other->d;
  dVar9 = this->a;
  dVar10 = other->e;
  dVar11 = this->c;
  dVar12 = other->f;
  dVar13 = this->b;
  dVar14 = other->e;
  dVar15 = this->d;
  dVar16 = other->f;
  this->a = this->a * other->a + this->c * other->b;
  this->b = this->b * dVar1 + this->d * dVar2;
  this->c = dVar3 * dVar4 + this->c * dVar5;
  this->d = dVar6 * dVar7 + this->d * dVar8;
  this->e = dVar9 * dVar10 + dVar11 * dVar12 + this->e;
  this->f = dVar13 * dVar14 + dVar15 * dVar16 + this->f;
  return;
}

Assistant:

void
QPDFMatrix::concat(QPDFMatrix const& other)
{
    double ap = (this->a * other.a) + (this->c * other.b);
    double bp = (this->b * other.a) + (this->d * other.b);
    double cp = (this->a * other.c) + (this->c * other.d);
    double dp = (this->b * other.c) + (this->d * other.d);
    double ep = (this->a * other.e) + (this->c * other.f) + this->e;
    double fp = (this->b * other.e) + (this->d * other.f) + this->f;
    this->a = ap;
    this->b = bp;
    this->c = cp;
    this->d = dp;
    this->e = ep;
    this->f = fp;
}